

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O0

ssize_t __thiscall
QNetworkAccessBackend::read(QNetworkAccessBackend *this,int __fd,void *__buf,size_t __nbytes)

{
  Int IVar1;
  undefined8 uVar2;
  undefined4 in_register_00000034;
  QMessageLogger *this_00;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffa8;
  IOFeature in_stack_ffffffffffffffac;
  char local_30 [32];
  QFlagsStorageHelper<QNetworkAccessBackend::IOFeature,_4> local_10;
  QFlagsStorageHelper<QNetworkAccessBackend::IOFeature,_4> local_c;
  long local_8;
  
  this_00 = (QMessageLogger *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.super_QFlagsStorage<QNetworkAccessBackend::IOFeature>.i =
       (QFlagsStorage<QNetworkAccessBackend::IOFeature>)ioFeatures((QNetworkAccessBackend *)this);
  local_c.super_QFlagsStorage<QNetworkAccessBackend::IOFeature>.i =
       (QFlagsStorage<QNetworkAccessBackend::IOFeature>)
       QFlags<QNetworkAccessBackend::IOFeature>::operator&
                 ((QFlags<QNetworkAccessBackend::IOFeature> *)this,in_stack_ffffffffffffffac);
  IVar1 = ::QFlags::operator_cast_to_int((QFlags *)&local_c);
  if (IVar1 == 0) {
    QMessageLogger::QMessageLogger
              (this_00,(char *)__buf,(int)((ulong)this >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    (*(code *)**(undefined8 **)this)();
    uVar2 = QMetaObject::className();
    QMessageLogger::warning
              (local_30,"Backend (%s) is not ZeroCopy and has not implemented read(...)!",uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QNetworkAccessBackend::read(char *data, qint64 maxlen)
{
    Q_UNUSED(data);
    Q_UNUSED(maxlen);
    if ((ioFeatures() & IOFeature::ZeroCopy) == 0) {
        qWarning("Backend (%s) is not ZeroCopy and has not implemented read(...)!",
                 metaObject()->className());
    }
    return 0;
}